

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O3

QString * __thiscall
DebugDirEntryWrapper::getFieldName
          (QString *__return_storage_ptr__,DebugDirEntryWrapper *this,size_t fieldId)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  switch(fieldId) {
  case 0:
    psVar1 = (storage_type *)0xf;
    break;
  case 1:
    if (this->dbgRootDir != (DebugDirWrapper *)0x0) {
      DebugDirWrapper::isRepro(this->dbgRootDir);
    }
    psVar1 = (storage_type *)0xd;
    break;
  case 2:
    goto LAB_00131abd;
  case 3:
LAB_00131abd:
    psVar1 = (storage_type *)0xc;
    break;
  case 4:
    psVar1 = (storage_type *)0x4;
    break;
  case 5:
    psVar1 = (storage_type *)0xa;
    break;
  case 6:
    goto LAB_00131b03;
  case 7:
LAB_00131b03:
    psVar1 = (storage_type *)0x10;
    break;
  default:
    (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
      super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = pcStack_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirEntryWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: return (dbgRootDir && dbgRootDir->isRepro()) ? "ReproChecksum" :"TimeDateStamp";
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case TYPE: return "Type";
        case DATA_SIZE: return "SizeOfData";
        case RAW_DATA_ADDR: return "AddressOfRawData";
        case RAW_DATA_PTR: return "PointerToRawData";
    }
    return getName();
}